

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvPendulum_dns.c
# Opt level: O3

int RefSol(sunrealtype tf,N_Vector yref,int nout)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  FILE *__stream;
  char *pcVar9;
  undefined4 in_register_00000034;
  int iVar10;
  int iVar11;
  sunrealtype t;
  double local_d8;
  long local_c0;
  double local_b8;
  ulong uStack_b0;
  long local_a8;
  sunrealtype local_a0;
  double local_98;
  ulong uStack_90;
  long local_80;
  long local_78;
  undefined8 local_70;
  double local_68;
  double local_60;
  N_Vector local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_70 = CONCAT44(in_register_00000034,nout);
  local_a0 = tf;
  lVar4 = N_VNew_Serial(2,sunctx);
  if (lVar4 == 0) {
    RefSol_cold_4();
    return -1;
  }
  pdVar5 = (double *)N_VGetArrayPointer(lVar4);
  *pdVar5 = 0.0;
  pdVar5[1] = 0.0;
  lVar6 = CVodeCreate(2,sunctx);
  local_c0 = lVar6;
  if (lVar6 == 0) {
    RefSol_cold_3();
    return 1;
  }
  uVar3 = CVodeInit(0,lVar6,fref,lVar4);
  if ((int)uVar3 < 0) {
    pcVar9 = "CVodeInit";
  }
  else {
    uVar3 = CVodeSStolerances(0x86a12b9b,0x86a12b9b,lVar6);
    if ((int)uVar3 < 0) {
      pcVar9 = "CVodeSStolerances";
    }
    else {
      lVar7 = SUNDenseMatrix(2,2,sunctx);
      if (lVar7 == 0) {
        RefSol_cold_2();
        return 1;
      }
      lVar8 = SUNLinSol_Dense(lVar4,lVar7,sunctx);
      if (lVar8 == 0) {
        RefSol_cold_1();
        return 1;
      }
      uVar3 = CVodeSetLinearSolver(lVar6,lVar8,lVar7);
      if ((int)uVar3 < 0) {
        pcVar9 = "CVodeSetLinearSolver";
      }
      else {
        uVar3 = CVodeSetMaxNumSteps(lVar6,100000);
        if ((int)uVar3 < 0) {
          pcVar9 = "CVodeSetMaxNumSteps";
        }
        else {
          uVar3 = CVodeSetStopTime(SUB84(local_a0,0),lVar6);
          if (-1 < (int)uVar3) {
            local_a8 = lVar4;
            local_80 = lVar8;
            local_78 = lVar7;
            local_58 = yref;
            __stream = fopen("cvPendulum_dns_ref.txt","w");
            local_b8 = *pdVar5;
            local_98 = pdVar5[1];
            uStack_90 = 0;
            local_60 = cos(local_b8);
            local_68 = sin(local_b8);
            local_d8 = -local_98;
            dVar1 = sin(local_b8);
            dVar2 = cos(local_b8);
            local_d8._0_4_ = SUB84(local_d8 * dVar1,0);
            fprintf(__stream,"%24.16e %24.16e %24.16e %24.16e %24.16e\n",0,SUB84(local_60,0),
                    local_68,local_d8._0_4_,local_98 * dVar2);
            if (0 < (int)local_70) {
              dVar1 = local_a0 / (double)(int)local_70;
              iVar10 = (int)local_70 + -1;
              iVar11 = 0;
              local_50 = dVar1;
              do {
                local_48 = dVar1;
                uVar3 = CVodeSetStopTime(local_c0);
                if ((int)uVar3 < 0) {
                  pcVar9 = "CVodeSetStopTime";
LAB_00102ee3:
                  fprintf(_stderr,"\nERROR: %s() returned = %d\n\n",pcVar9,(ulong)uVar3);
                  N_VDestroy_Serial(local_a8);
                  SUNMatDestroy(local_78);
                  SUNLinSolFree(local_80);
                  CVodeFree(&local_c0);
                  fclose(__stream);
                  return uVar3;
                }
                uVar3 = CVode(SUB84(local_a0,0),local_c0,local_a8,&local_38,1);
                if ((int)uVar3 < 0) {
                  pcVar9 = "CVode";
                  goto LAB_00102ee3;
                }
                local_b8 = *pdVar5;
                local_98 = pdVar5[1];
                uStack_90 = 0;
                local_60 = local_38;
                local_68 = cos(local_b8);
                local_40 = sin(local_b8);
                local_d8 = -local_98;
                dVar1 = sin(local_b8);
                dVar2 = cos(local_b8);
                local_d8._0_4_ = SUB84(local_d8 * dVar1,0);
                fprintf(__stream,"%24.16e %24.16e %24.16e %24.16e %24.16e\n",SUB84(local_60,0),
                        SUB84(local_68,0),local_40,local_d8._0_4_,local_98 * dVar2);
                dVar1 = local_a0;
                if (iVar11 < iVar10) {
                  dVar1 = local_48 + local_50;
                }
                iVar11 = iVar11 + 1;
              } while ((int)local_70 != iVar11);
            }
            fclose(__stream);
            dVar1 = *pdVar5;
            local_b8 = pdVar5[1];
            uStack_b0 = 0;
            pdVar5 = (double *)N_VGetArrayPointer(local_58);
            dVar2 = cos(dVar1);
            *pdVar5 = dVar2;
            dVar2 = sin(dVar1);
            pdVar5[1] = dVar2;
            local_98 = -local_b8;
            uStack_90 = uStack_b0 ^ 0x8000000000000000;
            dVar2 = sin(dVar1);
            pdVar5[2] = dVar2 * local_98;
            dVar1 = cos(dVar1);
            pdVar5[3] = dVar1 * local_b8;
            N_VDestroy_Serial(local_a8);
            SUNMatDestroy(local_78);
            SUNLinSolFree(local_80);
            CVodeFree(&local_c0);
            return 0;
          }
          pcVar9 = "CVodeSetStopTime";
        }
      }
    }
  }
  fprintf(_stderr,"\nERROR: %s() returned = %d\n\n",pcVar9,(ulong)uVar3);
  return 1;
}

Assistant:

int RefSol(sunrealtype tf, N_Vector yref, int nout)
{
  FILE* FID           = NULL; /* output file     */
  void* cvode_mem     = NULL; /* CVODE memory    */
  N_Vector yy         = NULL; /* solution vector */
  sunrealtype* yydata = NULL; /* vector data     */
  SUNMatrix A         = NULL; /* Jacobian matrix */
  SUNLinearSolver LS  = NULL; /* linear solver   */

  int retval;                            /* reusable return flag  */
  int out;                               /* output counter        */
  sunrealtype dtout;                     /* output frequency      */
  sunrealtype tout;                      /* output time           */
  sunrealtype t;                         /* return time           */
  sunrealtype th, thd;                   /* theta and theta dot   */
  sunrealtype tol = SUN_RCONST(1.0e-14); /* integration tolerance */

  /* Create the solution vector */
  yy = N_VNew_Serial(2, sunctx);
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return (-1); }

  /* Set the initial condition */
  yydata = N_VGetArrayPointer(yy);

  yydata[0] = ZERO; /* theta  */
  yydata[1] = ZERO; /* theta' */

  /* Create CVODE memory */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Initialize CVODE */
  retval = CVodeInit(cvode_mem, fref, ZERO, yy);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Set integration tolerances */
  retval = CVodeSStolerances(cvode_mem, tol, tol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(2, 2, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to CVODE */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set CVODE optional inputs */
  retval = CVodeSetMaxNumSteps(cvode_mem, 100000);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  retval = CVodeSetStopTime(cvode_mem, tf);
  if (check_retval(&retval, "CVodeSetStopTime", 1)) { return (1); }

  /* Open output file */
  FID = fopen("cvPendulum_dns_ref.txt", "w");

  /* Output initial condition */
  th  = yydata[0];
  thd = yydata[1];
  fprintf(FID,
          "%24.16" ESYM " %24.16" ESYM " %24.16" ESYM " %24.16" ESYM
          " %24.16" ESYM "\n",
          ZERO, COS(th), SIN(th), -thd * SIN(th), thd * COS(th));

  /* Integrate to tf and periodically output the solution */
  dtout = tf / nout;
  tout  = dtout;

  for (out = 0; out < nout; out++)
  {
    /* Set stop time (do not interpolate output) */
    retval = CVodeSetStopTime(cvode_mem, tout);
    if (check_retval(&retval, "CVodeSetStopTime", 1))
    {
      N_VDestroy_Serial(yy);
      SUNMatDestroy(A);
      SUNLinSolFree(LS);
      CVodeFree(&cvode_mem);
      fclose(FID);
      return (retval);
    }

    /* Integrate to tout */
    retval = CVode(cvode_mem, tf, yy, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1))
    {
      N_VDestroy_Serial(yy);
      SUNMatDestroy(A);
      SUNLinSolFree(LS);
      CVodeFree(&cvode_mem);
      fclose(FID);
      return (retval);
    }

    /* Write output */
    th  = yydata[0];
    thd = yydata[1];
    fprintf(FID,
            "%24.16" ESYM " %24.16" ESYM " %24.16" ESYM " %24.16" ESYM
            " %24.16" ESYM "\n",
            t, COS(th), SIN(th), -thd * SIN(th), thd * COS(th));

    /* Update output time */
    if (out < nout - 1) { tout += dtout; }
    else { tout = tf; }
  }

  /* Close output file */
  fclose(FID);

  /* Get solution components */
  th  = yydata[0];
  thd = yydata[1];

  /* Convert to Cartesian reference solution */
  yydata = N_VGetArrayPointer(yref);

  yydata[0] = COS(th);
  yydata[1] = SIN(th);
  yydata[2] = -thd * SIN(th);
  yydata[3] = thd * COS(th);

  /* Free memory */
  N_VDestroy_Serial(yy);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  CVodeFree(&cvode_mem);

  return (0);
}